

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

Adjacency_Graph<true> * __thiscall
Disa::Adjacency_Graph<true>::reorder
          (Adjacency_Graph<true> *__return_storage_ptr__,Adjacency_Graph<true> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permutation)

{
  value_type vVar1;
  value_type vVar2;
  size_t *psVar3;
  bool bVar4;
  source_location *psVar5;
  source_location *location;
  ostream *poVar6;
  size_type sVar7;
  size_t sVar8;
  long lVar9;
  reference pvVar10;
  size_t sVar11;
  const_reference pvVar12;
  size_t *psVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar17;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1d8;
  unsigned_long *local_1c8;
  anon_class_24_1_d0aac126 local_1c0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_198;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_190;
  undefined1 local_188 [8];
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  adjacency_iter;
  size_t *i_new_1;
  size_t i_old_1;
  size_t i_new;
  size_t i_old;
  undefined **local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  unsigned_long *local_128;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *permutation_local;
  Adjacency_Graph<true> *this_local;
  Adjacency_Graph<true> *graph;
  
  local_20 = permutation;
  permutation_local = &this->vertex_adjacent_list;
  this_local = __return_storage_ptr__;
  psVar5 = (source_location *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(permutation);
  location = (source_location *)size_vertex(this);
  if (psVar5 != location) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001dc240;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
    poVar6 = std::operator<<(poVar6,(string *)&local_40);
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
    std::__cxx11::to_string(&local_f8,sVar7);
    std::operator+(&local_d8,"Incorrect sizes, ",&local_f8);
    std::operator+(&local_b8,&local_d8," vs. ");
    sVar8 = size_vertex(this);
    std::__cxx11::to_string(&local_118,sVar8);
    std::operator+(&local_98,&local_b8,&local_118);
    std::operator+(&local_78,&local_98,".");
    poVar6 = std::operator<<(poVar6,(string *)&local_78);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  local_120._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(local_20);
  local_128 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(local_20);
  dVar14 = std::
           accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,double>
                     (local_120,
                      (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_128,0.0);
  sVar8 = size_vertex(this);
  psVar5 = (source_location *)size_vertex(this);
  lVar9 = (sVar8 - 1) * (long)psVar5;
  auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar16._0_8_ = lVar9;
  auVar16._12_4_ = 0x45300000;
  dVar15 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / 2.0;
  if ((dVar14 == dVar15) && (!NAN(dVar14) && !NAN(dVar15))) {
    i_old._7_1_ = 0;
    Adjacency_Graph(__return_storage_ptr__);
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->offset);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&__return_storage_ptr__->offset,sVar7);
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&this->vertex_adjacent_list);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&__return_storage_ptr__->vertex_adjacent_list,sVar7);
    bVar4 = empty(this);
    if (!bVar4) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&__return_storage_ptr__->offset,0);
      *pvVar10 = 0;
      for (i_new = 0; sVar8 = i_new, sVar11 = size_vertex(this), sVar8 < sVar11; i_new = i_new + 1)
      {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->offset,i_new + 1);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->offset,i_new);
        vVar2 = *pvVar10;
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (local_20,i_new);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&__return_storage_ptr__->offset,*pvVar12 + 1);
        *pvVar10 = vVar1 - vVar2;
      }
      for (i_old_1 = 0; sVar8 = i_old_1, sVar11 = size_vertex(this), sVar8 < sVar11;
          i_old_1 = i_old_1 + 1) {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&__return_storage_ptr__->offset,i_old_1);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&__return_storage_ptr__->offset,i_old_1 + 1);
        *pvVar10 = vVar1 + *pvVar10;
      }
    }
    i_new_1 = (size_t *)0x0;
    while( true ) {
      psVar3 = i_new_1;
      psVar13 = (size_t *)size_vertex(this);
      if (psVar13 <= psVar3) break;
      adjacency_iter.second._M_current =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (local_20,(size_type)i_new_1);
      pVar17 = vertex_adjacency_iter(this,(size_t *)&i_new_1);
      local_198 = pVar17.second._M_current;
      local_190 = pVar17.first._M_current;
      local_188 = (undefined1  [8])local_190._M_current;
      adjacency_iter.first._M_current = local_198._M_current;
      local_1a8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (&__return_storage_ptr__->vertex_adjacent_list);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&__return_storage_ptr__->offset,*adjacency_iter.second._M_current);
      local_1a0 = std::
                  next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (local_1a8,*pvVar10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_1c0.permutation,local_20);
      local_1c8 = (unsigned_long *)
                  std::
                  transform<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Adjacency_Graph<true>::reorder(std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::_lambda(unsigned_long_const&)_1_>
                            (local_190,local_198,local_1a0,&local_1c0);
      reorder(std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::
      {lambda(unsigned_long_const&)#1}::~vector((_lambda_unsigned_long_const___1_ *)&local_1c0);
      pVar17 = vertex_adjacency_iter(__return_storage_ptr__,adjacency_iter.second._M_current);
      local_1d8 = pVar17;
      std::
      pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator=((pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)local_188,&local_1d8);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_188,adjacency_iter.first);
      i_new_1 = (size_t *)((long)i_new_1 + 1);
    }
    swap(this,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
  local_150 = &PTR_s__workspace_llm4binary_github_lic_001dc258;
  console_format_abi_cxx11_(&local_148,(Disa *)0x0,(Log_Level)&local_150,psVar5);
  poVar6 = std::operator<<(poVar6,(string *)&local_148);
  poVar6 = std::operator<<(poVar6,"Checksum for parsed re_ordering failed, are the elements unique?"
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_148);
  exit(1);
}

Assistant:

Adjacency_Graph<_directed> Adjacency_Graph<_directed>::reorder(const std::vector<std::size_t>& permutation) {

  ASSERT_DEBUG(permutation.size() == size_vertex(), "Incorrect sizes, " + std::to_string(permutation.size()) + " vs. " +
                                                    std::to_string(size_vertex()) + ".");
  ASSERT_DEBUG(
  std::accumulate(permutation.begin(), permutation.end(), 0.0) == (size_vertex() - 1) * size_vertex() / 2.0,
  "Checksum for parsed re_ordering failed, are the elements unique?");

  // Allocate memory.
  Adjacency_Graph graph;
  graph.offset.resize(offset.size());
  graph.vertex_adjacent_list.resize(vertex_adjacent_list.size());

  // Set up the offsets for the new graph.
  if(!empty()) {
    graph.offset[0] = 0;
    FOR(i_old, size_vertex()) graph.offset[permutation[i_old] + 1] = offset[i_old + 1] - offset[i_old];
    FOR(i_new, size_vertex()) graph.offset[i_new + 1] += graph.offset[i_new];
  }

  // Populate the new graph using the reorder mapping.
  FOR(i_old, size_vertex()) {
    const std::size_t& i_new = permutation[i_old];
    auto adjacency_iter = vertex_adjacency_iter(i_old);
    std::transform(adjacency_iter.first, adjacency_iter.second,
                   std::next(graph.vertex_adjacent_list.begin(), static_cast<s_size_t>(graph.offset[i_new])),
                   [permutation](const std::size_t& i_old) { return permutation[i_old]; });
    adjacency_iter = graph.vertex_adjacency_iter(i_new);
    std::sort(adjacency_iter.first, adjacency_iter.second);
  }

  // swap class data and return.
  this->swap(graph);
  return graph;
}